

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O0

void __thiscall
Assimp::DXFImporter::GenerateHierarchy(DXFImporter *this,aiScene *pScene,FileData *param_2)

{
  uint uVar1;
  undefined1 auVar2 [16];
  aiNode *paVar3;
  uint *puVar4;
  ulong uVar5;
  aiNode **ppaVar6;
  aiNode *p;
  uint m;
  FileData *param_2_local;
  aiScene *pScene_local;
  DXFImporter *this_local;
  
  paVar3 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar3);
  pScene->mRootNode = paVar3;
  aiString::Set(&pScene->mRootNode->mName,"<DXF_ROOT>");
  if (pScene->mNumMeshes == 1) {
    pScene->mRootNode->mNumMeshes = 1;
    puVar4 = (uint *)operator_new__(4);
    pScene->mRootNode->mMeshes = puVar4;
    *pScene->mRootNode->mMeshes = 0;
  }
  else {
    uVar1 = pScene->mNumMeshes;
    pScene->mRootNode->mNumChildren = uVar1;
    auVar2 = ZEXT416(uVar1) * ZEXT816(8);
    uVar5 = auVar2._0_8_;
    if (auVar2._8_8_ != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    ppaVar6 = (aiNode **)operator_new__(uVar5);
    pScene->mRootNode->mChildren = ppaVar6;
    for (p._0_4_ = 0; (uint)p < pScene->mRootNode->mNumChildren; p._0_4_ = (uint)p + 1) {
      paVar3 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar3);
      pScene->mRootNode->mChildren[(uint)p] = paVar3;
      aiString::operator=((aiString *)paVar3,&pScene->mMeshes[(uint)p]->mName);
      paVar3->mNumMeshes = 1;
      puVar4 = (uint *)operator_new__(4);
      paVar3->mMeshes = puVar4;
      *paVar3->mMeshes = (uint)p;
      paVar3->mParent = pScene->mRootNode;
    }
  }
  return;
}

Assistant:

void DXFImporter::GenerateHierarchy(aiScene* pScene, DXF::FileData& /*output*/) {
    // generate the output scene graph, which is just the root node with a single child for each layer.
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("<DXF_ROOT>");

    if (1 == pScene->mNumMeshes)    {
        pScene->mRootNode->mMeshes = new unsigned int[ pScene->mRootNode->mNumMeshes = 1 ];
        pScene->mRootNode->mMeshes[0] = 0;
    } else {
        pScene->mRootNode->mChildren = new aiNode*[ pScene->mRootNode->mNumChildren = pScene->mNumMeshes ];
        for (unsigned int m = 0; m < pScene->mRootNode->mNumChildren;++m)   {
            aiNode* p = pScene->mRootNode->mChildren[m] = new aiNode();
            p->mName = pScene->mMeshes[m]->mName;

            p->mMeshes = new unsigned int[p->mNumMeshes = 1];
            p->mMeshes[0] = m;
            p->mParent = pScene->mRootNode;
        }
    }
}